

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp:360:60)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_object_object_cpp:360:60)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  value *pvVar1;
  long *plVar2;
  object *this_00;
  undefined8 *puVar3;
  uint *puVar4;
  pointer pvVar5;
  anon_class_16_1_570cf4e1_for_f *this_01;
  gc_heap_ptr_untyped *this_02;
  object_ptr o;
  object_ptr props;
  undefined1 local_a8 [32];
  value *local_88;
  undefined1 local_80 [24];
  _Manager_type local_68;
  _Invoker_type local_60;
  value local_58;
  
  this_01 = &this->f;
  local_88 = __return_storage_ptr__;
  pvVar1 = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  global_object::validate_object((global_object *)local_a8,pvVar1);
  plVar2 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
  pvVar5 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pvVar5) >> 3) *
      -0x33333333 < 2) {
    pvVar5 = (pointer)&value::undefined;
  }
  else {
    pvVar5 = pvVar5 + 1;
  }
  (**(code **)(*plVar2 + 0x88))(local_a8 + 0x10,plVar2,pvVar5);
  this_00 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_a8 + 0x10));
  object::own_property_names
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_80,this_00,false);
  if (local_80._0_8_ != local_80._8_8_) {
    this_02 = (gc_heap_ptr_untyped *)local_80._0_8_;
    do {
      puVar3 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_a8 + 0x10));
      puVar4 = (uint *)gc_heap_ptr_untyped::get(this_02);
      local_60 = (_Invoker_type)(puVar4 + 1);
      local_68 = (_Manager_type)(ulong)*puVar4;
      (**(code **)*puVar3)(&local_58,puVar3,&local_68);
      anon_unknown_33::define_own_property_checked
                (&this_01->global,(object_ptr *)local_a8,(string *)this_02,&local_58);
      value::destroy(&local_58);
      this_02 = this_02 + 1;
    } while (this_02 != (gc_heap_ptr_untyped *)local_80._8_8_);
  }
  std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
            ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_80);
  pvVar1 = local_88;
  local_88->type_ = object;
  (local_88->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)local_a8._0_8_;
  *(undefined4 *)((long)&local_88->field_1 + 8) = local_a8._8_4_;
  if ((gc_heap *)local_a8._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_a8._0_8_,(gc_heap_ptr_untyped *)&(local_88->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_a8 + 0x10));
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_a8);
  return pvVar1;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }